

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O2

int mbedtls_pk_write_key_pem(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  uint uVar1;
  mbedtls_pk_type_t mVar2;
  char *footer;
  char *header;
  size_t olen;
  uchar output_buf [5679];
  size_t local_1660;
  uchar local_1658 [5679];
  uchar uStack_29;
  
  local_1660 = 0;
  uVar1 = mbedtls_pk_write_key_der(key,local_1658,0x162f);
  if (-1 < (int)uVar1) {
    mVar2 = mbedtls_pk_get_type(key);
    if (mVar2 == MBEDTLS_PK_RSA) {
      footer = "-----END RSA PRIVATE KEY-----\n";
      header = "-----BEGIN RSA PRIVATE KEY-----\n";
    }
    else {
      mVar2 = mbedtls_pk_get_type(key);
      if (mVar2 != MBEDTLS_PK_ECKEY) {
        return -0x3980;
      }
      footer = "-----END EC PRIVATE KEY-----\n";
      header = "-----BEGIN EC PRIVATE KEY-----\n";
    }
    uVar1 = mbedtls_pem_write_buffer
                      (header,footer,&uStack_29 + -(ulong)uVar1,(ulong)uVar1,buf,size,&local_1660);
  }
  return uVar1;
}

Assistant:

int mbedtls_pk_write_key_pem( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char output_buf[PRV_DER_MAX_BYTES];
    const char *begin, *end;
    size_t olen = 0;

    PK_VALIDATE_RET( key != NULL );
    PK_VALIDATE_RET( buf != NULL || size == 0 );

    if( ( ret = mbedtls_pk_write_key_der( key, output_buf, sizeof(output_buf) ) ) < 0 )
        return( ret );

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        begin = PEM_BEGIN_PRIVATE_KEY_RSA;
        end = PEM_END_PRIVATE_KEY_RSA;
    }
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        begin = PEM_BEGIN_PRIVATE_KEY_EC;
        end = PEM_END_PRIVATE_KEY_EC;
    }
    else
#endif
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    if( ( ret = mbedtls_pem_write_buffer( begin, end,
                                  output_buf + sizeof(output_buf) - ret,
                                  ret, buf, size, &olen ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}